

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_AST.h
# Opt level: O0

void __thiscall
soul::AST::StructMemberRef::StructMemberRef
          (StructMemberRef *this,Context *c,Expression *o,StructurePtr *s,string *member)

{
  bool bVar1;
  Expression *e;
  bool local_3d;
  string *member_local;
  StructurePtr *s_local;
  Expression *o_local;
  Context *c_local;
  StructMemberRef *this_local;
  
  Expression::Expression(&this->super_Expression,StructMemberRef,c,value);
  (this->super_Expression).super_Statement.super_ASTObject._vptr_ASTObject =
       (_func_int **)&PTR__StructMemberRef_00588368;
  pool_ref<soul::AST::Expression>::pool_ref<soul::AST::Expression,void>(&this->object,o);
  RefCountedPtr<soul::Structure>::RefCountedPtr(&this->structure,s);
  std::__cxx11::string::string((string *)&this->memberName,(string *)member);
  e = pool_ref<soul::AST::Expression>::get(&this->object);
  bVar1 = isPossiblyValue(e);
  local_3d = false;
  if (bVar1) {
    local_3d = RefCountedPtr<soul::Structure>::operator!=(&this->structure,(Structure *)0x0);
  }
  checkAssertion(local_3d,"isPossiblyValue (object.get()) && structure != nullptr","StructMemberRef"
                 ,0x9e4);
  return;
}

Assistant:

StructMemberRef (const Context& c, Expression& o, StructurePtr s, std::string member)
            : Expression (ObjectType::StructMemberRef, c, ExpressionKind::value),
              object (o), structure (s), memberName (std::move (member))
        {
            SOUL_ASSERT (isPossiblyValue (object.get()) && structure != nullptr);
        }